

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

string * testing::internal::GetPrefixUntilComma_abi_cxx11_(char *str)

{
  char *in_RSI;
  string *in_RDI;
  char *comma;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  allocator *paVar1;
  string *this;
  allocator<char> local_2d [19];
  byte local_1a;
  allocator local_19;
  char *local_18;
  char *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  local_18 = strchr(in_RSI,0x2c);
  local_1a = 0;
  if (local_18 == (char *)0x0) {
    paVar1 = &local_19;
    std::allocator<char>::allocator();
    local_1a = 1;
    std::__cxx11::string::string((string *)this,local_10,paVar1);
  }
  else {
    __a = local_2d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (this,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__a);
    std::allocator<char>::~allocator(local_2d);
  }
  if ((local_1a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return in_RDI;
}

Assistant:

inline std::string GetPrefixUntilComma(const char* str) {
  const char* comma = strchr(str, ',');
  return comma == NULL ? str : std::string(str, comma);
}